

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O1

int ImportYUVAFromRGBA(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,uint8_t *a_ptr,int step,
                      int rgb_stride,float dithering,int use_iterative_conversion,
                      WebPPicture *picture)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  SharpYuvConversionMatrix *yuv_matrix;
  uint16_t *dst;
  long lVar15;
  _func_void_uint8_t_ptr_uint8_t_ptr_int **pp_Var16;
  ulong uVar17;
  long lVar18;
  uint32_t *puVar19;
  int iVar20;
  long lVar21;
  uint8_t *puVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  uint16_t *puVar26;
  int *piVar27;
  uint8_t *puVar28;
  uint8_t *puVar29;
  VP8Random *rg;
  bool bVar30;
  bool bVar31;
  double dVar32;
  uint8_t *local_1a8;
  uint8_t *local_198;
  uint8_t *local_190;
  uint8_t *local_188;
  uint8_t *local_180;
  uint8_t *local_148;
  VP8Random base_rg;
  
  uVar14 = picture->width;
  uVar23 = (ulong)uVar14;
  uVar7 = picture->height;
  bVar30 = true;
  if (a_ptr != (uint8_t *)0x0) {
    WebPInitAlphaProcessing();
    if (step == 1) {
      if (0 < (int)uVar7) {
        puVar29 = a_ptr;
        uVar12 = uVar7;
        do {
          iVar11 = (*WebPHasAlpha8b)(puVar29,uVar14);
          bVar30 = iVar11 == 0;
          if (!bVar30) break;
          puVar29 = puVar29 + rgb_stride;
          bVar10 = 1 < (int)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar10);
      }
    }
    else if (0 < (int)uVar7) {
      puVar29 = a_ptr;
      uVar12 = uVar7;
      do {
        iVar11 = (*WebPHasAlpha32b)(puVar29,uVar14);
        bVar30 = iVar11 == 0;
        if (!bVar30) break;
        puVar29 = puVar29 + rgb_stride;
        bVar10 = 1 < (int)uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar10);
    }
  }
  picture->colorspace = (uint)(bVar30 ^ 1) << 2;
  picture->use_argb = 0;
  iVar11 = WebPPictureAllocYUVA(picture);
  if (iVar11 == 0) {
    iVar11 = 0;
  }
  else {
    if (((use_iterative_conversion == 0) || ((int)uVar14 < 4)) || ((int)uVar7 < 4)) {
      uVar12 = (int)(uVar14 + 1) >> 1;
      dst = (uint16_t *)WebPSafeMalloc((long)(int)(uVar12 * 4),2);
      local_190 = picture->y;
      local_180 = picture->u;
      local_188 = picture->v;
      local_148 = picture->a;
      rg = (VP8Random *)0x0;
      bVar10 = dithering <= 0.0;
      if (bVar10) {
        puVar19 = (uint32_t *)&working_state_free_in_buffer;
      }
      else {
        puVar19 = base_rg.tab_;
        rg = &base_rg;
        VP8InitRandom(rg,dithering);
      }
      WebPInitConvertARGBToYUV();
      iVar11 = pthread_mutex_lock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
      if (iVar11 == 0) {
        if (((VP8CPUInfo)InitGammaTables_InitGammaTables_body_last_cpuinfo_used != VP8GetCPUInfo) &&
           (kGammaTablesOk == 0)) {
          puVar26 = kGammaToLinearTab;
          lVar21 = 0;
          do {
            dVar32 = pow((double)(int)lVar21 * 0.00392156862745098,0.8);
            *puVar26 = (uint16_t)(int)(dVar32 * 4095.0 + 0.5);
            lVar21 = lVar21 + 1;
            puVar26 = puVar26 + 1;
          } while (lVar21 != 0x100);
          piVar27 = kLinearToGammaTab;
          lVar21 = 0;
          do {
            dVar32 = pow((double)(int)lVar21 * 0.03125763125763126,1.25);
            *piVar27 = (int)(dVar32 * 255.0 + 0.5);
            lVar21 = lVar21 + 1;
            piVar27 = piVar27 + 1;
          } while (lVar21 != 0x21);
          kGammaTablesOk = 1;
        }
        InitGammaTables_InitGammaTables_body_last_cpuinfo_used = VP8GetCPUInfo;
        pthread_mutex_unlock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
      }
      if (dst == (uint16_t *)0x0) {
        uVar14 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
        rg = (VP8Random *)(ulong)uVar14;
      }
      else {
        puVar29 = b_ptr;
        puVar28 = r_ptr;
        local_1a8 = g_ptr;
        local_198 = a_ptr;
        if (0 < (int)uVar7 >> 1) {
          lVar15 = (long)(rgb_stride * 2);
          lVar21 = 0;
          if (bVar30 == false) {
            lVar21 = lVar15;
          }
          iVar11 = 0;
          do {
            if (!bVar10 || step != 3) {
              if (0 < (int)uVar14) {
                uVar17 = 0;
                lVar18 = 0;
                do {
                  bVar1 = puVar28[lVar18];
                  bVar2 = local_1a8[lVar18];
                  bVar3 = puVar29[lVar18];
                  if (rg == (VP8Random *)0x0) {
                    iVar20 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
                  }
                  else {
                    uVar8 = puVar19[rg->index1_];
                    uVar9 = puVar19[rg->index2_];
                    iVar20 = rg->amp_;
                    puVar19[rg->index1_] = uVar8 - uVar9 & 0x7fffffff;
                    iVar13 = rg->index1_ + 1;
                    if (iVar13 == 0x37) {
                      iVar13 = 0;
                    }
                    rg->index1_ = iVar13;
                    iVar13 = rg->index2_ + 1;
                    if (iVar13 == 0x37) {
                      iVar13 = 0;
                    }
                    rg->index2_ = iVar13;
                    iVar20 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                             ((short)(uVar8 - uVar9 >> 0xf) * iVar20 >> 8);
                  }
                  local_190[uVar17] = (uint8_t)((uint)(iVar20 + 0x108000) >> 0x10);
                  uVar17 = uVar17 + 1;
                  lVar18 = lVar18 + step;
                } while (uVar23 != uVar17);
              }
              if (0 < (int)uVar14) {
                iVar20 = picture->y_stride;
                uVar17 = 0;
                lVar18 = (long)rgb_stride;
                do {
                  bVar1 = puVar28[lVar18];
                  bVar2 = local_1a8[lVar18];
                  bVar3 = puVar29[lVar18];
                  if (rg == (VP8Random *)0x0) {
                    iVar13 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
                  }
                  else {
                    uVar8 = puVar19[rg->index1_];
                    uVar9 = puVar19[rg->index2_];
                    iVar13 = rg->amp_;
                    puVar19[rg->index1_] = uVar8 - uVar9 & 0x7fffffff;
                    iVar24 = rg->index1_ + 1;
                    if (iVar24 == 0x37) {
                      iVar24 = 0;
                    }
                    rg->index1_ = iVar24;
                    iVar24 = rg->index2_ + 1;
                    if (iVar24 == 0x37) {
                      iVar24 = 0;
                    }
                    rg->index2_ = iVar24;
                    iVar13 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                             ((short)(uVar8 - uVar9 >> 0xf) * iVar13 >> 8);
                  }
                  local_190[uVar17 + (long)iVar20] = (uint8_t)((uint)(iVar13 + 0x108000) >> 0x10);
                  uVar17 = uVar17 + 1;
                  lVar18 = lVar18 + step;
                } while (uVar23 != uVar17);
              }
            }
            else {
              if (r_ptr < b_ptr) {
                (*WebPConvertRGB24ToY)(puVar28,local_190,uVar14);
                iVar20 = picture->y_stride;
                pp_Var16 = &WebPConvertRGB24ToY;
                puVar22 = puVar28;
              }
              else {
                (*WebPConvertBGR24ToY)(puVar29,local_190,uVar14);
                iVar20 = picture->y_stride;
                pp_Var16 = &WebPConvertBGR24ToY;
                puVar22 = puVar29;
              }
              (**pp_Var16)(puVar22 + rgb_stride,local_190 + iVar20,uVar14);
            }
            iVar20 = picture->y_stride;
            bVar31 = true;
            if (bVar30 == false) {
              iVar13 = (*WebPExtractAlpha)(local_198,rgb_stride,uVar14,2,local_148,picture->a_stride
                                          );
              bVar31 = iVar13 != 0;
              local_148 = local_148 + (long)picture->a_stride * 2;
            }
            if (bVar31) {
              AccumulateRGB(puVar28,local_1a8,puVar29,step,rgb_stride,dst,uVar14);
            }
            else {
              AccumulateRGBA(puVar28,local_1a8,puVar29,local_198,rgb_stride,dst,uVar14);
            }
            if (rg == (VP8Random *)0x0) {
              (*WebPConvertRGBA32ToUV)(dst,local_180,local_188,uVar12);
            }
            else if (0 < (int)uVar12) {
              uVar17 = 0;
              do {
                uVar4 = dst[uVar17 * 4];
                uVar5 = dst[uVar17 * 4 + 1];
                uVar6 = dst[uVar17 * 4 + 2];
                uVar8 = puVar19[rg->index1_];
                uVar9 = puVar19[rg->index2_];
                iVar13 = rg->amp_;
                puVar19[rg->index1_] = uVar8 - uVar9 & 0x7fffffff;
                iVar24 = rg->index1_ + 1;
                if (iVar24 == 0x37) {
                  iVar24 = 0;
                }
                iVar25 = rg->index2_ + 1;
                if (iVar25 == 0x37) {
                  iVar25 = 0;
                }
                rg->index1_ = iVar24;
                rg->index2_ = iVar25;
                iVar13 = (uint)uVar6 * 0x7080 + (uint)uVar5 * -0x4a89 + (uint)uVar4 * -0x25f7 +
                         0x2020000 + (((int)((uVar8 - uVar9) * 2) >> 0xe) * iVar13 >> 8);
                if (iVar13 >> 0x12 < 1) {
                  iVar13 = 0;
                }
                iVar13 = iVar13 >> 0x12;
                if (0xfe < iVar13) {
                  iVar13 = 0xff;
                }
                local_180[uVar17] = (uint8_t)iVar13;
                uVar8 = puVar19[rg->index1_];
                uVar9 = puVar19[rg->index2_];
                iVar13 = rg->amp_;
                puVar19[rg->index1_] = uVar8 - uVar9 & 0x7fffffff;
                iVar24 = rg->index1_ + 1;
                if (iVar24 == 0x37) {
                  iVar24 = 0;
                }
                iVar25 = rg->index2_ + 1;
                if (iVar25 == 0x37) {
                  iVar25 = 0;
                }
                rg->index1_ = iVar24;
                rg->index2_ = iVar25;
                iVar13 = (uint)uVar6 * -0x124c + (uint)uVar5 * -0x5e34 + (uint)uVar4 * 0x7080 +
                         0x2020000 + (((int)((uVar8 - uVar9) * 2) >> 0xe) * iVar13 >> 8);
                if (iVar13 >> 0x12 < 1) {
                  iVar13 = 0;
                }
                iVar13 = iVar13 >> 0x12;
                if (0xfe < iVar13) {
                  iVar13 = 0xff;
                }
                local_188[uVar17] = (uint8_t)iVar13;
                uVar17 = uVar17 + 1;
              } while (uVar12 != uVar17);
            }
            local_190 = local_190 + (long)iVar20 * 2;
            local_180 = local_180 + picture->uv_stride;
            local_188 = local_188 + picture->uv_stride;
            puVar28 = puVar28 + lVar15;
            puVar29 = puVar29 + lVar15;
            local_1a8 = local_1a8 + lVar15;
            local_198 = local_198 + lVar21;
            iVar11 = iVar11 + 1;
          } while (iVar11 != (int)uVar7 >> 1);
        }
        if ((uVar7 & 1) != 0) {
          if (!bVar10 || step != 3) {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              lVar21 = 0;
              do {
                bVar1 = puVar28[lVar21];
                bVar2 = local_1a8[lVar21];
                bVar3 = puVar29[lVar21];
                if (rg == (VP8Random *)0x0) {
                  iVar11 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
                }
                else {
                  uVar8 = puVar19[rg->index1_];
                  uVar9 = puVar19[rg->index2_];
                  iVar11 = rg->amp_;
                  puVar19[rg->index1_] = uVar8 - uVar9 & 0x7fffffff;
                  iVar20 = rg->index1_ + 1;
                  if (iVar20 == 0x37) {
                    iVar20 = 0;
                  }
                  rg->index1_ = iVar20;
                  iVar20 = rg->index2_ + 1;
                  if (iVar20 == 0x37) {
                    iVar20 = 0;
                  }
                  rg->index2_ = iVar20;
                  iVar11 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                           ((short)(uVar8 - uVar9 >> 0xf) * iVar11 >> 8);
                }
                local_190[uVar17] = (uint8_t)((uint)(iVar11 + 0x108000) >> 0x10);
                uVar17 = uVar17 + 1;
                lVar21 = lVar21 + step;
              } while (uVar23 != uVar17);
            }
          }
          else {
            puVar22 = puVar29;
            if (puVar28 < puVar29) {
              puVar22 = puVar28;
            }
            pp_Var16 = &WebPConvertBGR24ToY;
            if (puVar28 < puVar29) {
              pp_Var16 = &WebPConvertRGB24ToY;
            }
            (**pp_Var16)(puVar22,local_190,uVar14);
          }
          if ((bVar30 == false) &&
             (iVar11 = (*WebPExtractAlpha)(local_198,0,uVar14,1,local_148,0), iVar11 == 0)) {
            AccumulateRGBA(puVar28,local_1a8,puVar29,local_198,0,dst,uVar14);
          }
          else {
            AccumulateRGB(puVar28,local_1a8,puVar29,step,0,dst,uVar14);
          }
          if (rg == (VP8Random *)0x0) {
            (*WebPConvertRGBA32ToUV)(dst,local_180,local_188,uVar12);
          }
          else if (0 < (int)uVar12) {
            uVar23 = 0;
            do {
              uVar4 = dst[uVar23 * 4];
              uVar5 = dst[uVar23 * 4 + 1];
              uVar6 = dst[uVar23 * 4 + 2];
              uVar8 = puVar19[rg->index1_];
              uVar9 = puVar19[rg->index2_];
              iVar11 = rg->amp_;
              puVar19[rg->index1_] = uVar8 - uVar9 & 0x7fffffff;
              iVar20 = rg->index1_ + 1;
              if (iVar20 == 0x37) {
                iVar20 = 0;
              }
              iVar13 = rg->index2_ + 1;
              if (iVar13 == 0x37) {
                iVar13 = 0;
              }
              rg->index1_ = iVar20;
              rg->index2_ = iVar13;
              iVar11 = (uint)uVar6 * 0x7080 + (uint)uVar5 * -0x4a89 + (uint)uVar4 * -0x25f7 +
                       0x2020000 + (((int)((uVar8 - uVar9) * 2) >> 0xe) * iVar11 >> 8);
              if (iVar11 >> 0x12 < 1) {
                iVar11 = 0;
              }
              iVar11 = iVar11 >> 0x12;
              if (0xfe < iVar11) {
                iVar11 = 0xff;
              }
              local_180[uVar23] = (uint8_t)iVar11;
              uVar8 = puVar19[rg->index1_];
              uVar9 = puVar19[rg->index2_];
              iVar11 = rg->amp_;
              puVar19[rg->index1_] = uVar8 - uVar9 & 0x7fffffff;
              iVar20 = rg->index1_ + 1;
              if (iVar20 == 0x37) {
                iVar20 = 0;
              }
              iVar13 = rg->index2_ + 1;
              if (iVar13 == 0x37) {
                iVar13 = 0;
              }
              rg->index1_ = iVar20;
              rg->index2_ = iVar13;
              iVar11 = (uint)uVar6 * -0x124c + (uint)uVar5 * -0x5e34 + (uint)uVar4 * 0x7080 +
                       0x2020000 + (((int)((uVar8 - uVar9) * 2) >> 0xe) * iVar11 >> 8);
              if (iVar11 >> 0x12 < 1) {
                iVar11 = 0;
              }
              iVar11 = iVar11 >> 0x12;
              if (0xfe < iVar11) {
                iVar11 = 0xff;
              }
              local_188[uVar23] = (uint8_t)iVar11;
              uVar23 = uVar23 + 1;
            } while (uVar12 != uVar23);
          }
        }
        WebPSafeFree(dst);
      }
      if (dst == (uint16_t *)0x0) {
        return (int)rg;
      }
    }
    else {
      SharpYuvInit(VP8GetCPUInfo);
      puVar29 = picture->y;
      iVar11 = picture->y_stride;
      puVar28 = picture->u;
      iVar20 = picture->uv_stride;
      puVar22 = picture->v;
      iVar13 = picture->width;
      iVar24 = picture->height;
      yuv_matrix = SharpYuvGetConversionMatrix(kSharpYuvMatrixWebp);
      iVar11 = SharpYuvConvert(r_ptr,g_ptr,b_ptr,step,rgb_stride,8,puVar29,iVar11,puVar28,iVar20,
                               puVar22,iVar20,8,iVar13,iVar24,yuv_matrix);
      if ((iVar11 == 0) &&
         (iVar11 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY), iVar11 == 0)) {
        return 0;
      }
      if (bVar30 == false) {
        (*WebPExtractAlpha)(a_ptr,rgb_stride,uVar14,uVar7,picture->a,picture->a_stride);
      }
    }
    iVar11 = 1;
  }
  return iVar11;
}

Assistant:

static int ImportYUVAFromRGBA(const uint8_t* r_ptr,
                              const uint8_t* g_ptr,
                              const uint8_t* b_ptr,
                              const uint8_t* a_ptr,
                              int step,         // bytes per pixel
                              int rgb_stride,   // bytes per scanline
                              float dithering,
                              int use_iterative_conversion,
                              WebPPicture* const picture) {
  int y;
  const int width = picture->width;
  const int height = picture->height;
  const int has_alpha = CheckNonOpaque(a_ptr, width, height, step, rgb_stride);
  const int is_rgb = (r_ptr < b_ptr);  // otherwise it's bgr

  picture->colorspace = has_alpha ? WEBP_YUV420A : WEBP_YUV420;
  picture->use_argb = 0;

  // disable smart conversion if source is too small (overkill).
  if (width < kMinDimensionIterativeConversion ||
      height < kMinDimensionIterativeConversion) {
    use_iterative_conversion = 0;
  }

  if (!WebPPictureAllocYUVA(picture)) {
    return 0;
  }
  if (has_alpha) {
    assert(step == 4);
#if defined(USE_GAMMA_COMPRESSION) && defined(USE_INVERSE_ALPHA_TABLE)
    assert(kAlphaFix + GAMMA_FIX <= 31);
#endif
  }

  if (use_iterative_conversion) {
    SharpYuvInit(VP8GetCPUInfo);
    if (!PreprocessARGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, picture)) {
      return 0;
    }
    if (has_alpha) {
      WebPExtractAlpha(a_ptr, rgb_stride, width, height,
                       picture->a, picture->a_stride);
    }
  } else {
    const int uv_width = (width + 1) >> 1;
    int use_dsp = (step == 3);  // use special function in this case
    // temporary storage for accumulated R/G/B values during conversion to U/V
    uint16_t* const tmp_rgb =
        (uint16_t*)WebPSafeMalloc(4 * uv_width, sizeof(*tmp_rgb));
    uint8_t* dst_y = picture->y;
    uint8_t* dst_u = picture->u;
    uint8_t* dst_v = picture->v;
    uint8_t* dst_a = picture->a;

    VP8Random base_rg;
    VP8Random* rg = NULL;
    if (dithering > 0.) {
      VP8InitRandom(&base_rg, dithering);
      rg = &base_rg;
      use_dsp = 0;   // can't use dsp in this case
    }
    WebPInitConvertARGBToYUV();
    InitGammaTables();

    if (tmp_rgb == NULL) {
      return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }

    // Downsample Y/U/V planes, two rows at a time
    for (y = 0; y < (height >> 1); ++y) {
      int rows_have_alpha = has_alpha;
      if (use_dsp) {
        if (is_rgb) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
          WebPConvertRGB24ToY(r_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
          WebPConvertBGR24ToY(b_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
        ConvertRowToY(r_ptr + rgb_stride,
                      g_ptr + rgb_stride,
                      b_ptr + rgb_stride, step,
                      dst_y + picture->y_stride, width, rg);
      }
      dst_y += 2 * picture->y_stride;
      if (has_alpha) {
        rows_have_alpha &= !WebPExtractAlpha(a_ptr, rgb_stride, width, 2,
                                             dst_a, picture->a_stride);
        dst_a += 2 * picture->a_stride;
      }
      // Collect averaged R/G/B(/A)
      if (!rows_have_alpha) {
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, rgb_stride, tmp_rgb, width);
      }
      // Convert to U/V
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
      dst_u += picture->uv_stride;
      dst_v += picture->uv_stride;
      r_ptr += 2 * rgb_stride;
      b_ptr += 2 * rgb_stride;
      g_ptr += 2 * rgb_stride;
      if (has_alpha) a_ptr += 2 * rgb_stride;
    }
    if (height & 1) {    // extra last row
      int row_has_alpha = has_alpha;
      if (use_dsp) {
        if (r_ptr < b_ptr) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
      }
      if (row_has_alpha) {
        row_has_alpha &= !WebPExtractAlpha(a_ptr, 0, width, 1, dst_a, 0);
      }
      // Collect averaged R/G/B(/A)
      if (!row_has_alpha) {
        // Collect averaged R/G/B
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, /* rgb_stride = */ 0,
                      tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, /* rgb_stride = */ 0,
                       tmp_rgb, width);
      }
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
    }
    WebPSafeFree(tmp_rgb);
  }
  return 1;
}